

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

_ElementType * __thiscall
Lib::
CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
::next(CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
       *this)

{
  byte *in_RSI;
  _ElementType *in_RDI;
  IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_> *unaff_retaddr;
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  *in_stack_ffffffffffffffd8;
  _ElementType *this_00;
  
  this_00 = in_RDI;
  hasNext(in_stack_ffffffffffffffd8);
  if ((*in_RSI & 1) == 0) {
    IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>::next(unaff_retaddr);
  }
  else {
    VirtualIterator<Indexing::TermLiteralClause>::next
              ((VirtualIterator<Indexing::TermLiteralClause> *)this_00);
  }
  return in_RDI;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }